

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall testing::internal::UnitTestImpl::ListTestsMatchingFilter(UnitTestImpl *this)

{
  pointer ppTVar1;
  TestCase *pTVar2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  bool bVar5;
  ulong uVar6;
  int iVar7;
  pointer str;
  char *str_00;
  size_t j;
  ulong uVar8;
  
  for (uVar6 = 0;
      ppTVar1 = (this->test_cases_).
                super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
      uVar6 < (ulong)((long)(this->test_cases_).
                            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3);
      uVar6 = uVar6 + 1) {
    pTVar2 = ppTVar1[uVar6];
    bVar5 = false;
    uVar8 = 0;
    while( true ) {
      lVar3 = *(long *)&(pTVar2->test_info_list_).
                        super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                        ._M_impl.super__Vector_impl_data;
      if ((ulong)((long)*(pointer *)
                         ((long)&(pTVar2->test_info_list_).
                                 super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                 ._M_impl + 8) - lVar3 >> 3) <= uVar8) break;
      lVar3 = *(long *)(lVar3 + uVar8 * 8);
      if (*(char *)(lVar3 + 0x82) == '\x01') {
        if (!bVar5) {
          printf("%s.",(pTVar2->name_)._M_dataplus._M_p);
          pbVar4 = (pTVar2->type_param_).ptr_;
          if ((pbVar4 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
             && ((pbVar4->_M_dataplus)._M_p != (pointer)0x0)) {
            iVar7 = 0x140762;
            printf("  # %s = ");
            pbVar4 = (pTVar2->type_param_).ptr_;
            if (pbVar4 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
            {
              str = (char *)0x0;
            }
            else {
              str = (pbVar4->_M_dataplus)._M_p;
            }
            PrintOnOneLine(str,iVar7);
          }
          putchar(10);
        }
        printf("  %s",*(undefined8 *)(lVar3 + 0x20));
        if ((*(long **)(lVar3 + 0x48) != (long *)0x0) && (**(long **)(lVar3 + 0x48) != 0)) {
          iVar7 = 0x14076c;
          printf("  # %s = ");
          if (*(undefined8 **)(lVar3 + 0x48) == (undefined8 *)0x0) {
            str_00 = (char *)0x0;
          }
          else {
            str_00 = (char *)**(undefined8 **)(lVar3 + 0x48);
          }
          PrintOnOneLine(str_00,iVar7);
        }
        putchar(10);
        bVar5 = true;
      }
      uVar8 = uVar8 + 1;
    }
  }
  fflush(_stdout);
  return;
}

Assistant:

void UnitTestImpl::ListTestsMatchingFilter() {
  // Print at most this many characters for each type/value parameter.
  const int kMaxParamLength = 250;

  for (size_t i = 0; i < test_cases_.size(); i++) {
    const TestCase* const test_case = test_cases_[i];
    bool printed_test_case_name = false;

    for (size_t j = 0; j < test_case->test_info_list().size(); j++) {
      const TestInfo* const test_info =
          test_case->test_info_list()[j];
      if (test_info->matches_filter_) {
        if (!printed_test_case_name) {
          printed_test_case_name = true;
          printf("%s.", test_case->name());
          if (test_case->type_param() != NULL) {
            printf("  # %s = ", kTypeParamLabel);
            // We print the type parameter on a single line to make
            // the output easy to parse by a program.
            PrintOnOneLine(test_case->type_param(), kMaxParamLength);
          }
          printf("\n");
        }
        printf("  %s", test_info->name());
        if (test_info->value_param() != NULL) {
          printf("  # %s = ", kValueParamLabel);
          // We print the value parameter on a single line to make the
          // output easy to parse by a program.
          PrintOnOneLine(test_info->value_param(), kMaxParamLength);
        }
        printf("\n");
      }
    }
  }
  fflush(stdout);
}